

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLVersionParser.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::VersionParser::parse15
          (VersionParser *this,ParserChar *elementName,ParserAttributes *attributes)

{
  FileLoader *pFVar1;
  int iVar2;
  RootParser15 *this_00;
  Parser *parser;
  
  createFunctionMap<COLLADASaxFWL::LibraryFlagsFunctionMapPair15,std::map<unsigned_long,GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>>>>
            (this->mFlags,this->mParsedFlags,&this->mFunctionMap15,
             (LibraryFlagsFunctionMapPair15 *)libraryFlagsFunctionMapMap15,
             libraryFlagsFunctionMapMapSize15);
  this_00 = (RootParser15 *)operator_new(0x28);
  RootParser15::RootParser15(this_00,this->mFileLoader);
  pFVar1 = this->mFileLoader;
  (pFVar1->super_DocumentProcessor).super_IFilePartLoader.mParserImpl = (IParserImpl *)this_00;
  parser = (Parser *)operator_new(0x1f0);
  COLLADASaxFWL15::ColladaParserAutoGen15Private::ColladaParserAutoGen15Private
            ((ColladaParserAutoGen15Private *)parser,
             &(this_00->super_IParserImpl15).super_ColladaParserAutoGen15,
             &((pFVar1->super_DocumentProcessor).mSaxParserErrorHandler)->super_IErrorHandler);
  this->mPrivateParser15 = (ColladaParserAutoGen15Private *)parser;
  pFVar1 = this->mFileLoader;
  pFVar1->mPrivateParser15 = (ColladaParserAutoGen15Private *)parser;
  parser[0xb].mSaxParser = (SaxParser *)&(pFVar1->super_DocumentProcessor).mExtraDataElementHandler;
  if ((this->mFunctionMap15)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    parser[10].mErrorHandler = (IErrorHandler *)&this->mFunctionMap15;
  }
  GeneratedSaxParser::SaxParser::setParser((this->super_Parser).mSaxParser,parser);
  iVar2 = (*(this->mPrivateParser15->
            super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
            ).super_ParserTemplateBase.super_Parser._vptr_Parser[2])
                    (this->mPrivateParser15,elementName,attributes);
  return SUB41(iVar2,0);
}

Assistant:

bool VersionParser::parse15( const ParserChar* elementName, const ParserAttributes& attributes )
    {
        createFunctionMap15();

        // note: rootParser is created with new because it is deleted in IFilePartLoader::~IFilePartLoader()
        RootParser15* rootParser = new RootParser15( mFileLoader );
        mFileLoader->setParserImpl( rootParser );
        mPrivateParser15 = new COLLADASaxFWL15::ColladaParserAutoGen15Private( rootParser, (GeneratedSaxParser::IErrorHandler*)mFileLoader->getErrorHandler() );
        mFileLoader->setPrivateParser( mPrivateParser15 );

        //privateParser.setCallbackObject( &rootParser );
		mPrivateParser15->registerUnknownElementHandler( &mFileLoader->mExtraDataElementHandler );

        if ( !mFunctionMap15.empty() )
        {
            mPrivateParser15->setElementFunctionMap( &mFunctionMap15 );
        }

        getSaxParser()->setParser( mPrivateParser15 );

        return mPrivateParser15->elementBegin( elementName, attributes );
    }